

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  byte bVar1;
  TValue *pTVar2;
  UpVal **ppUVar3;
  CClosure *f;
  TValue *fi;
  int n_local;
  int fidx_local;
  lua_State *L_local;
  
  pTVar2 = index2value(L,fidx);
  bVar1 = pTVar2->tt_ & 0x3f;
  if (bVar1 == 6) {
    ppUVar3 = getupvalref(L,fidx,n,(LClosure **)0x0);
    return *ppUVar3;
  }
  if (bVar1 != 0x16) {
    if (bVar1 != 0x26) {
      return (void *)0x0;
    }
    if ((0 < n) && (n <= (int)(uint)(byte)(pTVar2->value_).f[10])) {
      return (pTVar2->value_).f + (long)(n + -1) * 0x10 + 0x20;
    }
  }
  return (void *)0x0;
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  TValue *fi = index2value(L, fidx);
  switch (ttypetag(fi)) {
    case LUA_VLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL);
    }
    case LUA_VCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (1 <= n && n <= f->nupvalues)
        return &f->upvalue[n - 1];
      /* else */
    }  /* FALLTHROUGH */
    case LUA_VLCF:
      return NULL;  /* light C functions have no upvalues */
    default: {
      api_check(L, 0, "function expected");
      return NULL;
    }
  }
}